

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O2

bool __thiscall SQClass::GetAttributes(SQClass *this,SQObjectPtr *key,SQObjectPtr *outval)

{
  bool bVar1;
  SQClassMemberVec *pSVar2;
  SQObjectPtr idx;
  SQObjectPtr local_28;
  
  local_28.super_SQObject._type = OT_NULL;
  local_28.super_SQObject._unVal.pTable = (SQTable *)0x0;
  bVar1 = SQTable::Get(this->_members,key,&local_28);
  if (bVar1) {
    pSVar2 = &this->_methods;
    if (((uint)local_28.super_SQObject._unVal.fFloat >> 0x19 & 1) != 0) {
      pSVar2 = &this->_defaultvalues;
    }
    SQObjectPtr::operator=
              (outval,(SQObjectPtr *)
                      ((long)&(pSVar2->_vals->attrs).super_SQObject._type +
                      (ulong)(((uint)local_28.super_SQObject._unVal.fFloat & 0xffffff) << 5)));
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  return bVar1;
}

Assistant:

bool SQClass::GetAttributes(const SQObjectPtr &key,SQObjectPtr &outval)
{
    SQObjectPtr idx;
    if(_members->Get(key,idx)) {
        outval = (_isfield(idx)?_defaultvalues[_member_idx(idx)].attrs:_methods[_member_idx(idx)].attrs);
        return true;
    }
    return false;
}